

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

void Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,true,void>
               (uint *srcFirst,uint *srcLast,uint *dstFirst)

{
  type_conflict3 tVar1;
  type_conflict3 *in_RDX;
  anon_class_8_1_e1d520ba in_RSI;
  ValueType *in_RDI;
  ValueType prevBlock;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI.prevBlock) {
    tVar1 = boost::endian::endian_reverse<unsigned_int>(0);
    *in_RDX = tVar1;
    if (in_RDI + 1 != in_RSI.prevBlock) {
      std::
      transform<unsigned_int*,unsigned_int*,Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,true,void>(unsigned_int*,unsigned_int*,unsigned_int*)::_lambda(unsigned_int)_1_>
                (in_RDX + 1,(uint *)CONCAT44(tVar1,in_stack_ffffffffffffffe0),
                 (uint *)&stack0xffffffffffffffe4,in_RSI);
    }
  }
  return;
}

Assistant:

static void cryptBlocksInternal(InputIt srcFirst, InputIt srcLast, OutputIt dstFirst)
	{
		if (srcFirst == srcLast) {
			return;
		}

		typedef typename std::iterator_traits<InputIt>::value_type ValueType;
		using boost::endian::endian_reverse;

		ValueType prevBlock = endian_reverse(*srcFirst++);
		*dstFirst++ = (NeedSwapEndian ? prevBlock : endian_reverse(prevBlock));

		if (srcFirst == srcLast) {
			return;
		}

		std::transform(
			srcFirst, srcLast, dstFirst,
			[&prevBlock](const ValueType in) {
				const ValueType curBlock = endian_reverse(in);
				ValueType out = cryptBlock(curBlock, prevBlock);
				if (!NeedSwapEndian) {
					out = endian_reverse(out);
				}
				prevBlock = curBlock;
				return out;
			}
		);
	}